

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O0

int arkode_butcher_order6k
              (sunrealtype *b,sunrealtype **A,sunrealtype *c1,sunrealtype *c2,sunrealtype *c3,
              sunrealtype *c4,int s)

{
  int iVar1;
  sunrealtype *z;
  sunrealtype *z_00;
  sunrealtype *in_RCX;
  sunrealtype *in_RDX;
  sunrealtype **in_RSI;
  sunrealtype *in_RDI;
  sunrealtype *in_R8;
  sunrealtype *in_R9;
  double dVar2;
  sunrealtype *tmp2;
  sunrealtype *tmp1;
  sunrealtype bAcccc;
  double local_40;
  sunrealtype *local_38;
  sunrealtype *local_30;
  sunrealtype *local_28;
  sunrealtype *local_20;
  sunrealtype **local_18;
  sunrealtype *local_10;
  uint local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  z = (sunrealtype *)calloc((long)(int)tmp2,8);
  z_00 = (sunrealtype *)calloc((long)(int)tmp2,8);
  iVar1 = arkode_butcher_vv(local_20,local_28,(int)tmp2,z);
  if (iVar1 == 0) {
    iVar1 = arkode_butcher_vv(local_30,z,(int)tmp2,z_00);
    if (iVar1 == 0) {
      iVar1 = arkode_butcher_vv(local_38,z_00,(int)tmp2,z);
      if (iVar1 == 0) {
        iVar1 = arkode_butcher_mv(local_18,z,(int)tmp2,z_00);
        if (iVar1 == 0) {
          iVar1 = arkode_butcher_dot(local_10,z_00,(int)tmp2,&local_40);
          if (iVar1 == 0) {
            free(z);
            free(z_00);
            dVar2 = sqrt(2.220446049250313e-16);
            local_4 = (uint)(ABS(local_40 - 0.03333333333333333) <= dVar2);
          }
          else {
            local_4 = 0;
          }
        }
        else {
          free(z);
          free(z_00);
          local_4 = 0;
        }
      }
      else {
        free(z);
        free(z_00);
        local_4 = 0;
      }
    }
    else {
      free(z);
      free(z_00);
      local_4 = 0;
    }
  }
  else {
    free(z);
    free(z_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static sunbooleantype arkode_butcher_order6k(sunrealtype* b, sunrealtype** A,
                                             sunrealtype* c1, sunrealtype* c2,
                                             sunrealtype* c3, sunrealtype* c4,
                                             int s)
{
  sunrealtype bAcccc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c1, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c3, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c4, tmp2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp2, s, &bAcccc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bAcccc - SUN_RCONST(1.0) / SUN_RCONST(30.0)) > TOL) ? SUNFALSE
                                                                      : SUNTRUE;
}